

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

ApplVerID * FIX::Message::toApplVerID(ApplVerID *__return_storage_ptr__,BeginString *value)

{
  bool bVar1;
  string *__lhs;
  allocator<char> local_31;
  STRING local_30;
  
  __lhs = &(value->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator==(__lhs,"FIX.4.0");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"2",&local_31);
    ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
  }
  else {
    bVar1 = std::operator==(__lhs,"FIX.4.1");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"3",&local_31);
      ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
    }
    else {
      bVar1 = std::operator==(__lhs,"FIX.4.2");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"4",&local_31);
        ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
      }
      else {
        bVar1 = std::operator==(__lhs,"FIX.4.3");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"5",&local_31);
          ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
        }
        else {
          bVar1 = std::operator==(__lhs,"FIX.4.4");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"6",&local_31);
            ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
          }
          else {
            bVar1 = std::operator==(__lhs,"FIX.5.0");
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"7",&local_31);
              ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
            }
            else {
              bVar1 = std::operator==(__lhs,"FIX.5.0SP1");
              if (bVar1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_30,"8",&local_31);
                ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
              }
              else {
                bVar1 = std::operator==(__lhs,"FIX.5.0SP2");
                if (!bVar1) {
                  ApplVerID::ApplVerID(__return_storage_ptr__,__lhs);
                  return __return_storage_ptr__;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_30,"9",&local_31);
                ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static ApplVerID toApplVerID(const BeginString &value) {
    if (value == BeginString_FIX40) {
      return ApplVerID(ApplVerID_FIX40);
    }
    if (value == BeginString_FIX41) {
      return ApplVerID(ApplVerID_FIX41);
    }
    if (value == BeginString_FIX42) {
      return ApplVerID(ApplVerID_FIX42);
    }
    if (value == BeginString_FIX43) {
      return ApplVerID(ApplVerID_FIX43);
    }
    if (value == BeginString_FIX44) {
      return ApplVerID(ApplVerID_FIX44);
    }
    if (value == BeginString_FIX50) {
      return ApplVerID(ApplVerID_FIX50);
    }
    if (value == "FIX.5.0SP1") {
      return ApplVerID(ApplVerID_FIX50_SP1);
    }
    if (value == "FIX.5.0SP2") {
      return ApplVerID(ApplVerID_FIX50_SP2);
    }
    return ApplVerID(ApplVerID(value));
  }